

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
rtc::LogMessage::LogMessage
          (LogMessage *this,char *file,int line,LoggingSeverity sev,LogErrorContext err_ctx,int err,
          char *module)

{
  _Setfill<char> _Var1;
  uint32_t earlier;
  uint uVar2;
  _Setw _Var3;
  PlatformThreadId PVar4;
  ostream *poVar5;
  undefined8 uVar6;
  void *this_00;
  char *pcVar7;
  string local_1f8 [32];
  int local_1d8;
  char local_1d1;
  ostringstream local_1d0 [8];
  ostringstream tmp;
  PlatformThreadId id;
  uint32_t time;
  allocator local_29;
  int local_28;
  LogErrorContext local_24;
  int err_local;
  LogErrorContext err_ctx_local;
  LoggingSeverity sev_local;
  int line_local;
  char *file_local;
  LogMessage *this_local;
  
  local_28 = err;
  local_24 = err_ctx;
  err_local = sev;
  err_ctx_local = line;
  _sev_local = file;
  file_local = (char *)this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  this->severity_ = err_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tag_,"libjingle",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::__cxx11::string::string((string *)&this->extra_);
  if ((timestamp_ & 1) != 0) {
    earlier = LogStartTime();
    uVar2 = TimeSince(earlier);
    WallClockStartTime();
    poVar5 = std::operator<<((ostream *)this,"[");
    _Var1 = std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,_Var1._M_c);
    _Var3 = std::setw(3);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2 / 1000);
    poVar5 = std::operator<<(poVar5,":");
    _Var3 = std::setw(3);
    poVar5 = std::operator<<(poVar5,_Var3);
    uVar6 = std::ostream::operator<<(poVar5,uVar2 % 1000);
    _Var1 = std::setfill<char>(' ');
    poVar5 = std::operator<<(uVar6,_Var1._M_c);
    std::operator<<(poVar5,"] ");
  }
  if ((thread_ & 1) != 0) {
    PVar4 = CurrentThreadId();
    poVar5 = std::operator<<((ostream *)this,"[");
    this_00 = (void *)std::ostream::operator<<(poVar5,std::dec);
    poVar5 = (ostream *)std::ostream::operator<<(this_00,PVar4);
    std::operator<<(poVar5,"] ");
  }
  if (_sev_local != (char *)0x0) {
    poVar5 = std::operator<<((ostream *)this,"(");
    pcVar7 = anon_unknown_4::FilenameFromPath(_sev_local);
    poVar5 = std::operator<<(poVar5,pcVar7);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,err_ctx_local);
    std::operator<<(poVar5,"): ");
  }
  if (local_24 != ERRCTX_NONE) {
    std::__cxx11::ostringstream::ostringstream(local_1d0);
    poVar5 = std::operator<<((ostream *)local_1d0,"[0x");
    local_1d1 = (char)std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,local_1d1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
    local_1d8 = (int)std::setw(8);
    poVar5 = std::operator<<(poVar5,(_Setw)local_1d8);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_28);
    std::operator<<(poVar5,"]");
    if (local_24 == ERRCTX_EN) {
      poVar5 = std::operator<<((ostream *)local_1d0," ");
      pcVar7 = strerror(local_28);
      std::operator<<(poVar5,pcVar7);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)&this->extra_,local_1f8);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::ostringstream::~ostringstream(local_1d0);
  }
  return;
}

Assistant:

LogMessage::LogMessage(const char* file,
                       int line,
                       LoggingSeverity sev,
                       LogErrorContext err_ctx,
                       int err,
                       const char* module)
    : severity_(sev), tag_(kLibjingle) {
  if (timestamp_) {
    uint32_t time = TimeSince(LogStartTime());
    // Also ensure WallClockStartTime is initialized, so that it matches
    // LogStartTime.
    WallClockStartTime();
    print_stream_ << "[" << std::setfill('0') << std::setw(3) << (time / 1000)
                  << ":" << std::setw(3) << (time % 1000) << std::setfill(' ')
                  << "] ";
  }

  if (thread_) {
    PlatformThreadId id = CurrentThreadId();
    print_stream_ << "[" << std::dec << id << "] ";
  }

  if (file != NULL)
    print_stream_ << "(" << FilenameFromPath(file)  << ":" << line << "): ";

  if (err_ctx != ERRCTX_NONE) {
    std::ostringstream tmp;
    tmp << "[0x" << std::setfill('0') << std::hex << std::setw(8) << err << "]";
    switch (err_ctx) {
      case ERRCTX_ERRNO:
        tmp << " " << strerror(err);
        break;
#if WEBRTC_WIN
      case ERRCTX_HRESULT: {
        char msgbuf[256];
        DWORD flags = FORMAT_MESSAGE_FROM_SYSTEM;
        HMODULE hmod = GetModuleHandleA(module);
        if (hmod)
          flags |= FORMAT_MESSAGE_FROM_HMODULE;
        if (DWORD len = FormatMessageA(
            flags, hmod, err,
            MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
            msgbuf, sizeof(msgbuf) / sizeof(msgbuf[0]), NULL)) {
          while ((len > 0) &&
              isspace(static_cast<unsigned char>(msgbuf[len-1]))) {
            msgbuf[--len] = 0;
          }
          tmp << " " << msgbuf;
        }
        break;
      }
#endif  // WEBRTC_WIN
#if defined(WEBRTC_MAC) && !defined(WEBRTC_IOS)
      case ERRCTX_OSSTATUS: {
        tmp << " " << nonnull(GetMacOSStatusErrorString(err), "Unknown error");
        if (const char* desc = GetMacOSStatusCommentString(err)) {
          tmp << ": " << desc;
        }
        break;
      }
#endif  // WEBRTC_MAC && !defined(WEBRTC_IOS)
      default:
        break;
    }
    extra_ = tmp.str();
  }
}